

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::writeDataColumnWise(HinOut *this)

{
  _Setprecision _Var1;
  ostream *poVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  int i;
  ofstream f;
  int local_20c;
  string local_208 [520];
  
  std::ofstream::ofstream(local_208);
  std::ofstream::open(local_208,(int)in_RDI + 2000);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*(int *)(in_RDI + 0x7f0));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*(int *)(in_RDI + 0x7f4));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*(int *)(in_RDI + 0x8c0));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x7f0) + 1; local_20c = local_20c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x800),(long)local_20c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar3);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x8c0); local_20c = local_20c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x818),(long)local_20c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar3);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(9);
  std::operator<<((ostream *)local_208,_Var1);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x8c0); local_20c = local_20c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x830),(long)local_20c)
    ;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar4);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(9);
  std::operator<<((ostream *)local_208,_Var1);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x7f0); local_20c = local_20c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x848),(long)local_20c)
    ;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar4);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x7f0); local_20c = local_20c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x860),(long)local_20c)
    ;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar4);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x7f0); local_20c = local_20c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x878),(long)local_20c)
    ;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar4);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(9);
  std::operator<<((ostream *)local_208,_Var1);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x7f4); local_20c = local_20c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x890),(long)local_20c)
    ;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar4);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0x7f4); local_20c = local_20c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8a8),(long)local_20c)
    ;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_208,*pvVar4);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void HinOut::writeDataColumnWise() {
	ofstream f;
	int i;

	f.open (fileOut, ios::out );

	//counts
	f << onumCol << endl;
	f << onumRow << endl;
	f << oAcountX << endl;



	//matrix
	for (i=0; i<onumCol+1; i++)
		f << oAstart[i]<<" ";
	f<<endl;

	for (i=0; i<oAcountX; i++)
		f << oAindex[i]<<" ";
	f<<endl;

	f<<setprecision(9);
	for (i=0; i<oAcountX; i++)
		f  << oAvalue[i]<<" ";

	f<<endl;


	//cost and bounds
	f<<setprecision(9);
	for (i=0; i<onumCol; i++)
			f << ocolCost[i]<<" ";

	f<<endl;


	for (i=0; i<onumCol; i++)
			f << ocolLower[i]<<" ";
	f<<endl;


	for (i=0; i<onumCol; i++)
			f <<  ocolUpper[i]<<" ";
	f<<endl;

	f<<setprecision(9);
	for (i=0; i<onumRow; i++)
			f << orowLower[i]<<" ";
	f<<endl;


	for (i=0; i<onumRow; i++)
			f << orowUpper[i]<<" ";
	f<<endl;

	f.close();

}